

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O0

void __thiscall
zmq::router_t::xattach_pipe
          (router_t *this,pipe_t *pipe_,bool subscribe_to_all_,bool locally_initiated_)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  undefined8 in_RCX;
  char *__n;
  undefined1 in_DL;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  pipe_t *in_RSI;
  pipe_t *in_RDI;
  bool routing_id_ok;
  char *errstr_1;
  char *errstr;
  int rc;
  msg_t probe_msg;
  bool in_stack_000000cf;
  pipe_t *in_stack_000000d0;
  router_t *in_stack_000000d8;
  pipe_t *in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff81;
  undefined7 in_stack_ffffffffffffff88;
  set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
  *in_stack_ffffffffffffff90;
  msg_t local_58;
  byte local_12;
  undefined1 local_11;
  pipe_t *local_10;
  
  __n = (char *)(CONCAT71((int7)((ulong)in_RCX >> 8),in_DL) & 0xffffffffffffff01);
  local_11 = SUB81(__n,0);
  local_12 = (byte)in_RCX & 1;
  local_10 = in_RSI;
  if (in_RSI == (pipe_t *)0x0) {
    pcVar3 = "Assertion failed: %s (%s:%d)\n";
    __n = 
    "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
    ;
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","pipe_",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
            ,0x4e);
    fflush(_stderr);
    zmq_abort((char *)0x300136);
    in_RSI = (pipe_t *)pcVar3;
  }
  if ((in_RDI[6]._state & 0x10000) != active) {
    iVar2 = msg_t::init(&local_58,(EVP_PKEY_CTX *)in_RSI);
    __buf = extraout_RDX;
    if (iVar2 != 0) {
      piVar4 = __errno_location();
      pcVar3 = strerror(*piVar4);
      __n = 
      "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
      ;
      fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
              ,0x53);
      fflush(_stderr);
      zmq_abort((char *)0x3001bc);
      __buf = extraout_RDX_00;
    }
    iVar2 = (int)&local_58;
    pipe_t::write(local_10,iVar2,__buf,(size_t)__n);
    pipe_t::flush(in_RDI);
    iVar2 = msg_t::close(&local_58,iVar2);
    if (iVar2 != 0) {
      piVar4 = __errno_location();
      in_stack_ffffffffffffff90 =
           (set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_> *)
           strerror(*piVar4);
      fprintf(_stderr,"%s (%s:%d)\n",in_stack_ffffffffffffff90,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
              ,0x5c);
      fflush(_stderr);
      zmq_abort((char *)0x300258);
    }
  }
  bVar1 = identify_peer(in_stack_000000d8,in_stack_000000d0,in_stack_000000cf);
  if (bVar1) {
    fq_t::attach((fq_t *)CONCAT71(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
  }
  else {
    std::set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>::insert
              (in_stack_ffffffffffffff90,(value_type *)CONCAT17(bVar1,in_stack_ffffffffffffff88));
  }
  return;
}

Assistant:

void zmq::router_t::xattach_pipe (pipe_t *pipe_,
                                  bool subscribe_to_all_,
                                  bool locally_initiated_)
{
    LIBZMQ_UNUSED (subscribe_to_all_);

    zmq_assert (pipe_);

    if (_probe_router) {
        msg_t probe_msg;
        int rc = probe_msg.init ();
        errno_assert (rc == 0);

        rc = pipe_->write (&probe_msg);
        // zmq_assert (rc) is not applicable here, since it is not a bug.
        LIBZMQ_UNUSED (rc);

        pipe_->flush ();

        rc = probe_msg.close ();
        errno_assert (rc == 0);
    }

    const bool routing_id_ok = identify_peer (pipe_, locally_initiated_);
    if (routing_id_ok)
        _fq.attach (pipe_);
    else
        _anonymous_pipes.insert (pipe_);
}